

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  uint32_t uVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  byte *pbVar6;
  char input [1024];
  byte local_418 [1032];
  
  pbVar6 = local_418;
  printf("Please enter a roman numerals: ");
  pcVar3 = fgets((char *)local_418,0x400,_stdin);
  iVar5 = 1;
  if (pcVar3 != (char *)0x0) {
    while( true ) {
      bVar1 = *pbVar6;
      if ((0x15 < bVar1 - 0x43) || ((0x280643U >> (bVar1 - 0x43 & 0x1f) & 1) == 0)) break;
      pbVar6 = pbVar6 + 1;
    }
    if ((bVar1 == 0) || (bVar1 == 10)) {
      sVar4 = strlen((char *)local_418);
      uVar2 = roman_to_decimal((char *)local_418,sVar4 - 1);
      iVar5 = 0;
      printf("%u\n",(ulong)uVar2);
    }
    else {
      puts("Invalid roman number!");
    }
  }
  return iVar5;
}

Assistant:

int main(int argc, char** argv) {
  char input[1024];
  printf("Please enter a roman numerals: ");
  if (fgets(input, sizeof input, stdin) == NULL) return 1;

  for (size_t n = 0; input[n] != 0 && input[n] != '\n'; n++) {
    switch (input[n]) {
      case 'I':
      case 'V':
      case 'X':
      case 'L':
      case 'C':
      case 'D':
      case 'M':
        // noop
        break;
      default:
        printf("Invalid roman number!\n");
        return 1;
    }
  }

  uint32_t res = roman_to_decimal(input, strlen(input) - 1);
  printf("%" PRIu32 "\n", res);
  return 0;
}